

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  __last;
  pointer psVar1;
  bool bVar2;
  type_conflict tVar3;
  bool bVar4;
  Classifier CVar5;
  HorribleError *pHVar6;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var7;
  size_type sVar8;
  App *pAVar9;
  size_t sVar10;
  ArgumentMismatch *pAVar11;
  int num;
  Option *pOVar12;
  pointer pbVar13;
  int iVar14;
  pointer psVar15;
  int local_3c4;
  allocator<char> local_3b9;
  string v;
  App *sub;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  int result_count;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_348;
  string arg_name;
  string rest;
  string value;
  string current;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  anon_class_40_2_a297e68f_for__M_pred local_1b8;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)&current,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  arg_name._M_dataplus._M_p = (pointer)&arg_name.field_2;
  arg_name._M_string_length = 0;
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  rest._M_dataplus._M_p = (pointer)&rest.field_2;
  rest._M_string_length = 0;
  arg_name.field_2._M_local_buf[0] = '\0';
  value.field_2._M_local_buf[0] = '\0';
  rest.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    bVar2 = detail::split_short(&current,&arg_name,&rest);
    if (!bVar2) {
      pHVar6 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Short parsed but missing! You should not see this",
                 (allocator<char> *)&v);
      HorribleError::HorribleError(pHVar6,&local_b0);
      __cxa_throw(pHVar6,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar2 = detail::split_windows_style(&current,&arg_name,&value);
    if (!bVar2) {
      pHVar6 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",
                 (allocator<char> *)&v);
      HorribleError::HorribleError(pHVar6,&local_d0);
      __cxa_throw(pHVar6,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar6 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this",
                 (allocator<char> *)&v);
      HorribleError::HorribleError(pHVar6,&local_f0);
      __cxa_throw(pHVar6,&HorribleError::typeinfo,Error::~Error);
    }
    bVar2 = detail::split_long(&current,&arg_name,&value);
    if (!bVar2) {
      pHVar6 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_90,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar6,&local_90);
      __cxa_throw(pHVar6,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var7._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::std::__cxx11::string::string((string *)&local_1b8,&arg_name);
  local_1b8.current_type = current_type;
  _Var7 = ::std::
          find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                    (_Var7,__last,&local_1b8);
  ::std::__cxx11::string::~string((string *)&local_1b8);
  if (_Var7._M_current ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar1 = (this->subcommands_).
             super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar15 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar1;
        psVar15 = psVar15 + 1) {
      pAVar9 = (psVar15->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar9->name_)._M_string_length == 0) && (pAVar9->disabled_ == false)) &&
         (bVar2 = _parse_arg(pAVar9,args,current_type,param_3), bVar2)) {
        pAVar9 = (psVar15->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar2 = true;
        if (pAVar9->pre_parse_called_ == false) {
          _trigger_pre_parse(pAVar9,(long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5);
        }
        goto LAB_00184393;
      }
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (&arg_name,'.',1);
      if (sVar8 != 0xffffffffffffffff) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&v,&arg_name,0,sVar8);
        pAVar9 = _find_subcommand(this,&v,true,false);
        ::std::__cxx11::string::~string((string *)&v);
        sub = pAVar9;
        if (pAVar9 != (App *)0x0) {
          ::std::__cxx11::string::string
                    ((string *)&v,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&nval,&arg_name,sVar8 + 1,0xffffffffffffffff);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&arg_name,&nval);
          ::std::__cxx11::string::~string((string *)&nval);
          if (arg_name._M_string_length < 2) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&nval,&v,sVar8 + 2,0xffffffffffffffff);
            *nval._M_dataplus._M_p = '-';
            if (2 < nval._M_string_length) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result_count,&nval,3,0xffffffffffffffff);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result_count);
              ::std::__cxx11::string::~string((string *)&result_count);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              resize(&nval,2);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&nval);
            ::std::__cxx11::string::~string((string *)&nval);
            current_type = SHORT;
          }
          else {
            ::std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&result_count,"--",&local_3b9);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                      (&local_1d8,&v,sVar8 + 3,0xffffffffffffffff);
            ::std::operator+(&nval,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&result_count,&local_1d8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       &nval);
            ::std::__cxx11::string::~string((string *)&nval);
            ::std::__cxx11::string::~string((string *)&local_1d8);
            ::std::__cxx11::string::~string((string *)&result_count);
            current_type = LONG;
          }
          bVar4 = _parse_arg(pAVar9,args,current_type,true);
          if (bVar4) {
            if (pAVar9->silent_ == false) {
              std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                        (&this->parsed_subcommands_,&sub);
            }
            increment_parsed(this);
            _trigger_pre_parse(this,(long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5);
            if ((sub->parse_complete_callback_).super__Function_base._M_manager !=
                (_Manager_type)0x0) {
              _process_env(sub);
              _process_callbacks(sub);
              _process_help_flags(sub,false,false);
              _process_requirements(sub);
              run_callback(sub,false,true);
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(args);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,&v);
          }
          ::std::__cxx11::string::~string((string *)&v);
          bVar2 = true;
          if (bVar4) goto LAB_00184393;
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (this->fallthrough_ != true)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          bVar2 = true;
          _move_to_missing(this,current_type,&current);
        }
        else {
          pAVar9 = _get_fallthrough_parent(this);
          bVar2 = _parse_arg(pAVar9,args,current_type,false);
        }
        goto LAB_00184393;
      }
    }
    bVar2 = false;
    goto LAB_00184393;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  pOVar12 = ((_Var7._M_current)->_M_t).
            super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
            super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar12->inject_separator_ == true) &&
      (pbVar13 = *(pointer *)
                  ((long)&(pOVar12->results_).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 8),
      (pOVar12->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar13)) && (pbVar13[-1]._M_string_length != 0))
  {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    Option::add_result(pOVar12,&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  if ((pOVar12->trigger_on_result_ == true) && (pOVar12->current_option_state_ == callback_run)) {
    Option::clear(pOVar12);
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  iVar14 = pOVar12->type_size_min_;
  num = pOVar12->expected_min_ * iVar14;
  if (iVar14 <= num) {
    num = iVar14;
  }
  local_3c4 = Option::get_items_expected_max(pOVar12);
  if (local_3c4 < 0x2000000) {
LAB_00183cbd:
    result_count = 0;
    if (local_3c4 != 0) goto LAB_00183d74;
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_218,&value);
    Option::get_flag_value(&v,pOVar12,&arg_name,&local_218);
    ::std::__cxx11::string::~string((string *)&local_218);
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_238,&v);
    Option::add_result(pOVar12,&local_238);
    ::std::__cxx11::string::~string((string *)&local_238);
    nval._M_dataplus._M_p =
         (pointer)((_Var7._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
               (Option **)&nval);
    ::std::__cxx11::string::~string((string *)&v);
    local_3c4 = 0;
LAB_00183e53:
    iVar14 = 0;
  }
  else {
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar12->allow_extra_args_ == false) {
      v._M_dataplus._M_p._0_4_ = pOVar12->type_size_max_;
      tVar3 = detail::checked_multiply<int>((int *)&v,pOVar12->expected_min_);
      local_3c4 = 0x20000000;
      if (tVar3) {
        local_3c4 = (int)v._M_dataplus._M_p;
        goto LAB_00183cbd;
      }
    }
LAB_00183d74:
    result_count = 0;
    if (value._M_string_length == 0) {
      if (rest._M_string_length == 0) goto LAB_00183e53;
      pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_278,&rest);
      Option::add_result(pOVar12,&local_278,&result_count);
      ::std::__cxx11::string::~string((string *)&local_278);
      v._M_dataplus._M_p =
           (pointer)((_Var7._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)&v);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&rest,"");
      iVar14 = result_count;
    }
    else {
      pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_258,&value);
      Option::add_result(pOVar12,&local_258,&result_count);
      ::std::__cxx11::string::~string((string *)&local_258);
      v._M_dataplus._M_p =
           (pointer)((_Var7._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 (Option **)&v);
      iVar14 = result_count;
    }
  }
  local_348 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
  while (iVar14 < num) {
    pbVar13 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start == pbVar13) {
      pAVar11 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      Option::get_name_abi_cxx11_
                (&local_110,
                 ((_Var7._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
      Option::get_type_name_abi_cxx11_
                (&local_130,
                 ((_Var7._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
      ArgumentMismatch::TypedAtLeast(pAVar11,&local_110,num,&local_130);
      __cxa_throw(pAVar11,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::string((string *)&v,pbVar13 + -1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::__cxx11::string::string((string *)&local_50,&v);
    Option::add_result(pOVar12,&local_50,&result_count);
    ::std::__cxx11::string::~string((string *)&local_50);
    nval._M_dataplus._M_p =
         (pointer)((_Var7._M_current)->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
              (local_348,(Option **)&nval);
    iVar14 = iVar14 + result_count;
    ::std::__cxx11::string::~string((string *)&v);
  }
  if ((iVar14 < local_3c4) ||
     (pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
     pOVar12->allow_extra_args_ == true)) {
    sVar10 = _count_remaining_positionals(this,true);
    local_390 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)_Var7;
    while ((iVar14 < local_3c4 ||
           ((((_Var7._M_current)->_M_t).
             super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != false))
          ) {
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar13) goto LAB_00184065;
      CVar5 = _recognize(this,pbVar13 + -1,false);
      pbVar13 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((CVar5 != NONE) ||
         ((ulong)((long)pbVar13 -
                  (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= sVar10))
      goto LAB_00184065;
      if (this->validate_optional_arguments_ == true) {
        ::std::__cxx11::string::string((string *)&v,pbVar13 + -1);
        Option::_validate(&nval,(local_390->_M_t).
                                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&v,0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&v,&nval);
        ::std::__cxx11::string::~string((string *)&nval);
        sVar8 = v._M_string_length;
        ::std::__cxx11::string::~string((string *)&v);
        pbVar13 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        _Var7._M_current = local_390;
        if (sVar8 != 0) goto LAB_00184065;
      }
      pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_70,pbVar13 + -1);
      Option::add_result(pOVar12,&local_70,&result_count);
      ::std::__cxx11::string::~string((string *)&local_70);
      v._M_dataplus._M_p =
           (pointer)((_Var7._M_current)->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_348,(Option **)&v);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      iVar14 = iVar14 + result_count;
    }
    pbVar13 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
LAB_00184065:
    if (((args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != pbVar13) &&
       (CVar5 = _recognize(this,pbVar13 + -1,true), CVar5 == POSITIONAL_MARK)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
    }
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if ((0 < local_3c4) && (iVar14 == 0 && num == 0)) {
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      local_150._M_string_length = 0;
      local_150.field_2._M_local_buf[0] = '\0';
      Option::get_flag_value(&v,pOVar12,&arg_name,&local_150);
      ::std::__cxx11::string::~string((string *)&local_150);
      pOVar12 = (local_390->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::__cxx11::string::string((string *)&local_298,&v);
      Option::add_result(pOVar12,&local_298);
      ::std::__cxx11::string::~string((string *)&local_298);
      _Var7._M_current = local_390;
      nval._M_dataplus._M_p =
           (pointer)(local_390->_M_t).
                    super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                    super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                    super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                (local_348,(Option **)&nval);
      ::std::__cxx11::string::~string((string *)&v);
      pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    }
  }
  if ((0 < num) && (iVar14 % pOVar12->type_size_max_ != 0)) {
    if (pOVar12->type_size_max_ == pOVar12->type_size_min_) {
      pAVar11 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
      Option::get_name_abi_cxx11_
                (&local_170,
                 ((_Var7._M_current)->_M_t).
                 super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
      pOVar12 = ((_Var7._M_current)->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar14 = pOVar12->type_size_min_;
      Option::get_type_name_abi_cxx11_(&local_190,pOVar12);
      ArgumentMismatch::PartialType(pAVar11,&local_170,iVar14,&local_190);
      __cxa_throw(pAVar11,&ArgumentMismatch::typeinfo,Error::~Error);
    }
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    local_2b8._M_string_length = 0;
    local_2b8.field_2._M_local_buf[0] = '\0';
    Option::add_result(pOVar12,&local_2b8);
    ::std::__cxx11::string::~string((string *)&local_2b8);
    pOVar12 = ((_Var7._M_current)->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  if (pOVar12->trigger_on_result_ == true) {
    Option::run_callback(pOVar12);
  }
  if (rest._M_string_length != 0) {
    ::std::operator+(&v,"-",&rest);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&rest,&v);
    ::std::__cxx11::string::~string((string *)&v);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&rest);
  }
  bVar2 = true;
LAB_00184393:
  ::std::__cxx11::string::~string((string *)&rest);
  ::std::__cxx11::string::~string((string *)&value);
  ::std::__cxx11::string::~string((string *)&arg_name);
  ::std::__cxx11::string::~string((string *)&current);
  return bVar2;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    if(op_ptr == std::end(options_)) {
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}